

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O0

ON_TextStyle * Internal_DefaultTextStyle(void)

{
  ON_UUID id;
  ON_TextStyle *in_RDI;
  ON_UUID default_text_style_id;
  ON_TextStyle *text_style;
  
  ON_TextStyle::ON_TextStyle(in_RDI);
  id.Data4[0] = 0xb6;
  id.Data4[1] = 0xa0;
  id.Data4[2] = 0xfa;
  id.Data4[3] = 'O';
  id.Data4[4] = 'v';
  id.Data4[5] = 0xc9;
  id.Data4[6] = 0xd9;
  id.Data4[7] = '\x18';
  id.Data1 = 0x8f3a5848;
  id.Data2 = 0x7741;
  id.Data3 = 0x4aa9;
  Internal_TextStyleInit(L"Default",id,-1,&ON_Font::Default,in_RDI);
  return in_RDI;
}

Assistant:

static ON_TextStyle Internal_DefaultTextStyle()
{
  // {8F3A5848-7741-4AA9-B6A0-FA4F76C9D918}
  const ON_UUID default_text_style_id =
  { 0x8f3a5848, 0x7741, 0x4aa9,{ 0xb6, 0xa0, 0xfa, 0x4f, 0x76, 0xc9, 0xd9, 0x18 } };

  ON_TextStyle text_style;
  Internal_TextStyleInit(L"Default", default_text_style_id, -1, &ON_Font::Default, text_style);
  return text_style;
}